

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void deqp::gls::LifetimeTests::details::addTestCases(TestCaseGroup *group,Types *types)

{
  TestContext *pTVar1;
  InputAttacher *pIVar2;
  OutputAttacher *pOVar3;
  Types *pTVar4;
  int iVar5;
  TestNode *pTVar6;
  TestBase *pTVar7;
  undefined4 extraout_var;
  TestNode *node;
  Attacher *extraout_RDX;
  Attacher *extraout_RDX_00;
  Attacher *extraout_RDX_01;
  Attacher *extraout_RDX_02;
  Attacher *extraout_RDX_03;
  Attacher *extraout_RDX_04;
  Attacher *extraout_RDX_05;
  Attacher *extraout_RDX_06;
  Attacher *extraout_RDX_07;
  Attacher *pAVar8;
  pointer ppOVar9;
  long lVar10;
  pointer ppAVar11;
  pointer ppIVar12;
  string name;
  undefined1 local_68 [32];
  TestContext *local_48;
  TestNode *local_40;
  Types *local_38;
  
  pTVar1 = (types->super_ContextWrapper).m_ctx.m_testCtx;
  lVar10 = 0;
  local_38 = types;
  do {
    createLifeTestGroup((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        local_68,pTVar1,(LifeTestSpec *)(s_lifeTests + lVar10),&types->m_types);
    tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)local_68._0_8_);
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0xa0);
  pTVar6 = (TestNode *)operator_new(0x70);
  local_48 = pTVar1;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar1,"delete_used","Delete current program");
  tcu::TestNode::addChild(&group->super_TestNode,pTVar6);
  pTVar7 = (TestBase *)operator_new(0xc0);
  iVar5 = (**local_38->_vptr_Types)();
  TestBase::TestBase(pTVar7,"program","program",
                     (Context *)((_func_int **)CONCAT44(extraout_var,iVar5) + 4));
  (pTVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestBase_0217a560;
  pTVar7[1].super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)CONCAT44(extraout_var,iVar5);
  pTVar7[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)LifeTest::testDeleteUsed;
  pTVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar1 = local_48;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,local_48,"attach","Attachment tests");
  tcu::TestNode::addChild(&group->super_TestNode,pTVar6);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pTVar1,"deleted_name","Name of deleted attachment");
  local_40 = pTVar6;
  tcu::TestNode::addChild(pTVar6,node);
  pTVar4 = local_38;
  ppAVar11 = (local_38->m_attachers).
             super__Vector_base<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pAVar8 = extraout_RDX;
  if (ppAVar11 !=
      (local_38->m_attachers).
      super__Vector_base<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      attacherName_abi_cxx11_((string *)local_68,(details *)*ppAVar11,pAVar8);
      pTVar7 = (TestBase *)operator_new(0xc0);
      pAVar8 = *ppAVar11;
      TestBase::TestBase(pTVar7,(char *)local_68._0_8_,(char *)local_68._0_8_,
                         &(pAVar8->super_ContextWrapper).m_ctx);
      (pTVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestBase_0217a5b0
      ;
      pTVar7[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pAVar8;
      pTVar7[1].super_TestCase.super_TestNode.m_testCtx =
           (TestContext *)AttachmentTest::testDeletedNames;
      pTVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
      tcu::TestNode::addChild(node,(TestNode *)pTVar7);
      pAVar8 = extraout_RDX_00;
      if ((TestNode *)local_68._0_8_ != (TestNode *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        pAVar8 = extraout_RDX_01;
      }
      ppAVar11 = ppAVar11 + 1;
    } while (ppAVar11 !=
             (pTVar4->m_attachers).
             super__Vector_base<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_48,"deleted_input","Input from deleted attachment");
  tcu::TestNode::addChild(local_40,pTVar6);
  ppIVar12 = (pTVar4->m_inAttachers).
             super__Vector_base<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pAVar8 = extraout_RDX_02;
  if (ppIVar12 !=
      (pTVar4->m_inAttachers).
      super__Vector_base<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      attacherName_abi_cxx11_((string *)local_68,(details *)(*ppIVar12)->m_attacher,pAVar8);
      pTVar7 = (TestBase *)operator_new(0xb0);
      pIVar2 = *ppIVar12;
      TestBase::TestBase(pTVar7,(char *)local_68._0_8_,(char *)local_68._0_8_,
                         &(pIVar2->super_ContextWrapper).m_ctx);
      (pTVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestBase_0217a600
      ;
      pTVar7[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pIVar2;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
      pAVar8 = extraout_RDX_03;
      if ((TestNode *)local_68._0_8_ != (TestNode *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        pAVar8 = extraout_RDX_04;
      }
      ppIVar12 = ppIVar12 + 1;
    } while (ppIVar12 !=
             (pTVar4->m_inAttachers).
             super__Vector_base<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_48,"deleted_output","Output to deleted attachment");
  tcu::TestNode::addChild(local_40,pTVar6);
  ppOVar9 = (pTVar4->m_outAttachers).
            super__Vector_base<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar8 = extraout_RDX_05;
  if (ppOVar9 !=
      (pTVar4->m_outAttachers).
      super__Vector_base<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      attacherName_abi_cxx11_((string *)local_68,(details *)(*ppOVar9)->m_attacher,pAVar8);
      pTVar7 = (TestBase *)operator_new(0xb0);
      pOVar3 = *ppOVar9;
      TestBase::TestBase(pTVar7,(char *)local_68._0_8_,(char *)local_68._0_8_,
                         &(pOVar3->super_ContextWrapper).m_ctx);
      (pTVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestBase_0217a650
      ;
      pTVar7[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pOVar3;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
      pAVar8 = extraout_RDX_06;
      if ((TestNode *)local_68._0_8_ != (TestNode *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        pAVar8 = extraout_RDX_07;
      }
      ppOVar9 = ppOVar9 + 1;
    } while (ppOVar9 !=
             (pTVar4->m_outAttachers).
             super__Vector_base<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void addTestCases (TestCaseGroup& group, Types& types)
{
	TestContext& testCtx = types.getTestContext();

	for (const LifeTestSpec* it = DE_ARRAY_BEGIN(s_lifeTests);
		 it != DE_ARRAY_END(s_lifeTests); ++it)
		group.addChild(createLifeTestGroup(testCtx, *it, types.getTypes()).release());

	{
		TestCaseGroup* const delUsedGroup =
			new TestCaseGroup(testCtx, "delete_used", "Delete current program");
		group.addChild(delUsedGroup);

		delUsedGroup->addChild(
			new LifeTest("program", "program", types.getProgramType(),
						 &LifeTest::testDeleteUsed));
	}

	{
		TestCaseGroup* const	attGroup	= new TestCaseGroup(
			testCtx, "attach", "Attachment tests");
		group.addChild(attGroup);

		{
			TestCaseGroup* const	nameGroup	= new TestCaseGroup(
				testCtx, "deleted_name", "Name of deleted attachment");
			attGroup->addChild(nameGroup);

			const vector<Attacher*>& atts = types.getAttachers();
			for (vector<Attacher*>::const_iterator it = atts.begin(); it != atts.end(); ++it)
			{
				const string name = attacherName(**it);
				nameGroup->addChild(new AttachmentTest(name.c_str(), name.c_str(), **it,
													   &AttachmentTest::testDeletedNames));
			}
		}
		{
			TestCaseGroup* inputGroup = new TestCaseGroup(
				testCtx, "deleted_input", "Input from deleted attachment");
			attGroup->addChild(inputGroup);

			const vector<InputAttacher*>& inAtts = types.getInputAttachers();
			for (vector<InputAttacher*>::const_iterator it = inAtts.begin();
				 it != inAtts.end(); ++it)
			{
				const string name = attacherName((*it)->getAttacher());
				inputGroup->addChild(new InputAttachmentTest(name.c_str(), name.c_str(), **it));
			}
		}
		{
			TestCaseGroup* outputGroup = new TestCaseGroup(
				testCtx, "deleted_output", "Output to deleted attachment");
			attGroup->addChild(outputGroup);

			const vector<OutputAttacher*>& outAtts = types.getOutputAttachers();
			for (vector<OutputAttacher*>::const_iterator it = outAtts.begin();
				 it != outAtts.end(); ++it)
			{
				string name = attacherName((*it)->getAttacher());
				outputGroup->addChild(new OutputAttachmentTest(name.c_str(), name.c_str(),
															   **it));
			}
		}
	}
}